

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.h
# Opt level: O0

void __thiscall
glslang::TType::TType(TType *this,TSampler *sampler,TStorageQualifier q,TArraySizes *as)

{
  TArraySizes *as_local;
  TStorageQualifier q_local;
  TSampler *sampler_local;
  TType *this_local;
  
  this->_vptr_TType = (_func_int **)&PTR__TType_010d8758;
  *(uint *)&this->field_0x8 = *(uint *)&this->field_0x8 & 0xffffff00 | 0xe;
  *(uint *)&this->field_0x8 = *(uint *)&this->field_0x8 & 0xfffff0ff | 0x100;
  *(uint *)&this->field_0x8 = *(uint *)&this->field_0x8 & 0xffff0fff;
  *(uint *)&this->field_0x8 = *(uint *)&this->field_0x8 & 0xfff0ffff;
  *(uint *)&this->field_0x8 = *(uint *)&this->field_0x8 & 0xffefffff;
  *(uint *)&this->field_0x8 = *(uint *)&this->field_0x8 & 0xffdfffff;
  *(uint *)&this->field_0x8 = *(uint *)&this->field_0x8 & 0xffbfffff;
  *(uint *)&this->field_0x8 = *(uint *)&this->field_0x8 & 0xfc7fffff;
  *(uint *)&this->field_0x8 = *(uint *)&this->field_0x8 & 0xfbffffff;
  *(uint *)&this->field_0x8 = *(uint *)&this->field_0x8 & 0xf7ffffff;
  this->arraySizes = as;
  (this->field_13).structure = (TTypeList *)0x0;
  this->fieldName = (TString *)0x0;
  this->typeName = (TString *)0x0;
  this->sampler = *sampler;
  this->typeParameters = (TTypeParameters *)0x0;
  this->spirvType = (TSpirvType *)0x0;
  TQualifier::clear(&this->qualifier);
  *(ulong *)&(this->qualifier).field_0x8 =
       *(ulong *)&(this->qualifier).field_0x8 & 0xffffffffffffff80 | (ulong)q & 0x7f;
  return;
}

Assistant:

TType(const TSampler& sampler, TStorageQualifier q = EvqUniform, TArraySizes* as = nullptr) :
        basicType(EbtSampler), vectorSize(1u), matrixCols(0u), matrixRows(0u), vector1(false), coopmatNV(false), coopmatKHR(false), coopmatKHRuse(0), coopmatKHRUseValid(false), coopvecNV(false),
        arraySizes(as), structure(nullptr), fieldName(nullptr), typeName(nullptr),
        sampler(sampler), typeParameters(nullptr), spirvType(nullptr)
    {
        qualifier.clear();
        qualifier.storage = q;
    }